

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

String * __thiscall CommandInfo::signature(String *__return_storage_ptr__,CommandInfo *this)

{
  List<CommandArgument> *this_00;
  DataType DVar1;
  bool bVar2;
  size_type sVar3;
  CommandArgument *pCVar4;
  char cVar5;
  int n;
  String local_d0;
  string local_b0 [32];
  String local_90;
  string local_70 [32];
  String local_50;
  
  (__return_storage_ptr__->_string)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_string).field_2;
  (__return_storage_ptr__->_string)._M_string_length = 0;
  (__return_storage_ptr__->_string).field_2._M_local_buf[0] = '\0';
  dataTypeName(&local_50,this->returnvalue);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  cVar5 = (char)__return_storage_ptr__;
  std::__cxx11::string::push_back(cVar5);
  std::__cxx11::string::string(local_70,(string *)this);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::~string(local_70);
  this_00 = &this->args;
  bVar2 = List<CommandArgument>::isEmpty(this_00);
  if (!bVar2) {
    std::__cxx11::string::push_back(cVar5);
  }
  std::__cxx11::string::push_back(cVar5);
  bVar2 = false;
  n = 0;
  while( true ) {
    sVar3 = std::deque<CommandArgument,_std::allocator<CommandArgument>_>::size(&this_00->_deque);
    if ((int)sVar3 <= n) break;
    if (n == this->minargs) {
      bVar2 = true;
      std::__cxx11::string::push_back(cVar5);
    }
    if (n != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    pCVar4 = List<CommandArgument>::operator[](this_00,n);
    dataTypeName(&local_90,pCVar4->type);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::push_back(cVar5);
    pCVar4 = List<CommandArgument>::operator[](this_00,n);
    std::__cxx11::string::string(local_b0,(string *)&pCVar4->name);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::~string(local_b0);
    if (this->minargs <= n) {
      pCVar4 = List<CommandArgument>::operator[](this_00,n);
      DVar1 = pCVar4->type;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (DVar1 == TYPE_String) {
        std::__cxx11::string::push_back(cVar5);
      }
      pCVar4 = List<CommandArgument>::operator[](this_00,n);
      String::fromNumber(&local_d0,pCVar4->defvalue);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_d0);
      if (DVar1 == TYPE_String) {
        std::__cxx11::string::push_back(cVar5);
      }
    }
    n = n + 1;
  }
  if (bVar2) {
    std::__cxx11::string::push_back(cVar5);
  }
  std::__cxx11::string::push_back(cVar5);
  return __return_storage_ptr__;
}

Assistant:

String CommandInfo::signature()
{
	String text;
	text += dataTypeName (returnvalue);
	text += ' ';
	text += name;

	if (args.isEmpty() == false)
		text += ' ';

	text += '(';

	bool hasoptionals = false;

	for (int i = 0; i < args.size(); i++)
	{
		if (i == minargs)
		{
			hasoptionals = true;
			text += '[';
		}

		if (i)
			text += ", ";

		text += dataTypeName (args[i].type);
		text += ' ';
		text += args[i].name;

		if (i >= minargs)
		{
			bool isString = args[i].type == TYPE_String;
			text += " = ";

			if (isString)
				text += '"';

			text += String::fromNumber (args[i].defvalue);

			if (isString)
				text += '"';
		}
	}

	if (hasoptionals)
		text += ']';

	text += ')';
	return text;
}